

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qwidgetrepaintmanager.cpp
# Opt level: O2

void __thiscall QWidgetRepaintManager::addStaticWidget(QWidgetRepaintManager *this,QWidget *widget)

{
  bool bVar1;
  long in_FS_OFFSET;
  parameter_type local_18;
  long local_10;
  
  local_10 = *(long *)(in_FS_OFFSET + 0x28);
  local_18 = widget;
  if (widget != (QWidget *)0x0) {
    bVar1 = QListSpecialMethodsBase<QWidget*>::contains<QWidget*>
                      ((QListSpecialMethodsBase<QWidget*> *)(this + 0x68),&local_18);
    if (!bVar1) {
      QList<QWidget_*>::append((QList<QWidget_*> *)(this + 0x68),local_18);
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_10) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QWidgetRepaintManager::addStaticWidget(QWidget *widget)
{
    if (!widget)
        return;

    Q_ASSERT(widget->testAttribute(Qt::WA_StaticContents));
    if (!staticWidgets.contains(widget))
        staticWidgets.append(widget);
}